

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.hpp
# Opt level: O2

bool __thiscall duckdb::WindowInputExpression::CellIsNull(WindowInputExpression *this,idx_t i)

{
  unsigned_long *puVar1;
  reference vector;
  bool bVar2;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&this->chunk->data,this->col_idx);
  if (this->scalar == true) {
    puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = (*puVar1 & 1) == 0;
    }
    return bVar2;
  }
  bVar2 = FlatVector::IsNull(vector,i);
  return bVar2;
}

Assistant:

inline bool CellIsNull(idx_t i) const {
		D_ASSERT(!chunk.data.empty());
		auto &col = chunk.data[col_idx];

		if (scalar) {
			return ConstantVector::IsNull(col);
		}
		return FlatVector::IsNull(col, i);
	}